

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# halfEdgeMesh.cpp
# Opt level: O0

Vector3D * __thiscall
CMU462::Vertex::neighborhoodCentroid(Vector3D *__return_storage_ptr__,Vertex *this)

{
  bool bVar1;
  pointer pHVar2;
  pointer pVVar3;
  _Self local_50;
  _List_const_iterator<CMU462::Halfedge> local_48;
  _List_node_base *local_40;
  _List_const_iterator<CMU462::Halfedge> local_38;
  _List_const_iterator<CMU462::Vertex> local_30;
  _List_const_iterator<CMU462::Halfedge> local_28;
  HalfedgeCIter h;
  double d;
  Vertex *this_local;
  Vector3D *c;
  
  Vector3D::Vector3D(__return_storage_ptr__,0.0,0.0,0.0);
  h._M_node = (_List_node_base *)0x0;
  local_28._M_node = (_List_node_base *)halfedge(this);
  do {
    pHVar2 = std::_List_const_iterator<CMU462::Halfedge>::operator->(&local_28);
    local_38._M_node = (_List_node_base *)Halfedge::next(pHVar2);
    pHVar2 = std::_List_const_iterator<CMU462::Halfedge>::operator->(&local_38);
    local_30._M_node = (_List_node_base *)Halfedge::vertex(pHVar2);
    pVVar3 = std::_List_const_iterator<CMU462::Vertex>::operator->(&local_30);
    Vector3D::operator+=(__return_storage_ptr__,&pVVar3->position);
    h._M_node = (_List_node_base *)(h._M_node + 1.0);
    pHVar2 = std::_List_const_iterator<CMU462::Halfedge>::operator->(&local_28);
    local_48._M_node = (_List_node_base *)Halfedge::twin(pHVar2);
    pHVar2 = std::_List_const_iterator<CMU462::Halfedge>::operator->(&local_48);
    local_40 = (_List_node_base *)Halfedge::next(pHVar2);
    local_28._M_node = local_40;
    local_50._M_node = (_List_node_base *)halfedge(this);
    bVar1 = std::operator!=(&local_28,&local_50);
  } while (bVar1);
  Vector3D::operator/=(__return_storage_ptr__,(double *)&h);
  return __return_storage_ptr__;
}

Assistant:

Vector3D Vertex::neighborhoodCentroid() const
  {
    Vector3D c( 0., 0., 0. ); // centroid
    double d = 0.; // degree (i.e., number of neighbors)

    // Iterate over neighbors.
    HalfedgeCIter h = halfedge();
    do {
      // Add the contribution of the neighbor,
      // and increment the number of neighbors.
      c += h->next()->vertex()->position;
      d += 1.;

      h = h->twin()->next();
    } while( h != halfedge() );

    c /= d; // compute the average

    return c;
  }